

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_exception.hxx
# Opt level: O0

void __thiscall
cornerstone::rpc_exception::rpc_exception(rpc_exception *this,string *err,ptr<req_msg> *req)

{
  shared_ptr<cornerstone::req_msg> *in_RDX;
  exception *in_RDI;
  shared_ptr<cornerstone::req_msg> *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__rpc_exception_00247bb8;
  std::shared_ptr<cornerstone::req_msg>::shared_ptr(in_RDX,in_stack_ffffffffffffff98);
  std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  return;
}

Assistant:

rpc_exception(const std::string& err, ptr<req_msg> req) : req_(req), err_(err.c_str())
    {
    }